

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O3

Apply * __thiscall
jsonnet::internal::Desugarer::stdFunc
          (Desugarer *this,LocationRange *loc,UString *name,AST *a,AST *b)

{
  Apply *pAVar1;
  long lVar2;
  Fodder *this_00;
  initializer_list<jsonnet::internal::ArgParam> __l;
  bool local_13c;
  bool local_13b;
  allocator_type local_13a;
  bool local_139;
  LocationRange *local_138;
  AST *local_130;
  AST *local_128;
  Index *local_120;
  vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_> local_118;
  void *local_100;
  void *local_f8;
  LiteralString *local_f0;
  Var *local_e8;
  ArgParam local_e0;
  ArgParam local_88;
  
  local_138 = loc;
  local_130 = a;
  local_128 = b;
  local_e8 = std(this);
  local_139 = false;
  local_e0.idFodder.
  super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 5;
  local_f0 = Allocator::
             make<jsonnet::internal::LiteralString,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::__cxx11::u32string_const&,jsonnet::internal::LiteralString::TokenKind,char_const(&)[1],char_const(&)[1]>
                       (this->alloc,(LocationRange *)E,
                        (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                         *)EF,name,(TokenKind *)&local_e0,(char (*) [1])0x25f777,
                        (char (*) [1])0x25f777);
  local_f8 = (void *)0x0;
  local_100 = (void *)0x0;
  local_120 = Allocator::
              make<jsonnet::internal::Index,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Var*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool,jsonnet::internal::LiteralString*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                        (this->alloc,(LocationRange *)E,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&local_e8,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&local_139,&local_f0,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&local_f8,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF,&local_100,
                         (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                          *)EF);
  ArgParam::ArgParam(&local_e0,local_130,(Fodder *)EF);
  ArgParam::ArgParam(&local_88,local_128,(Fodder *)EF);
  __l._M_len = 2;
  __l._M_array = &local_e0;
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            (&local_118,__l,&local_13a);
  local_13b = false;
  local_13c = true;
  pAVar1 = Allocator::
           make<jsonnet::internal::Apply,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::Index*,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::ArgParam,std::allocator<jsonnet::internal::ArgParam>>,bool,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,bool>
                     (this->alloc,local_138,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,&local_120,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,&local_118,&local_13b,
                      (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                       *)EF,(vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF,&local_13c);
  ::std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::~vector
            (&local_118);
  lVar2 = -0xb0;
  this_00 = &local_88.commaFodder;
  do {
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector(this_00);
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)((long)(this_00 + -2) + 0x10));
    ::std::
    vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
    ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             *)((long)(this_00 + -3) + 8));
    this_00 = (Fodder *)((long)(this_00 + -4) + 8);
    lVar2 = lVar2 + 0x58;
  } while (lVar2 != 0);
  return pAVar1;
}

Assistant:

Apply *stdFunc(const LocationRange &loc, const UString &name, AST *a, AST *b)
    {
        return make<Apply>(
            loc,
            EF,
            make<Index>(E, EF, std(), EF, false, str(name), EF, nullptr, EF, nullptr, EF),
            EF,
            ArgParams{{a, EF}, {b, EF}},
            false,  // trailingComma
            EF,
            EF,
            true  // tailstrict
        );
    }